

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

CompressedStorage<double,_int> * __thiscall
Eigen::internal::CompressedStorage<double,_int>::operator=
          (CompressedStorage<double,_int> *this,CompressedStorage<double,_int> *other)

{
  Index IVar1;
  CompressedStorage<double,_int> *other_local;
  CompressedStorage<double,_int> *this_local;
  
  IVar1 = size(other);
  resize(this,IVar1,0.0);
  IVar1 = size(other);
  if (0 < IVar1) {
    smart_copy<double>(other->m_values,other->m_values + this->m_size,this->m_values);
    smart_copy<int>(other->m_indices,other->m_indices + this->m_size,this->m_indices);
  }
  return this;
}

Assistant:

CompressedStorage& operator=(const CompressedStorage& other)
    {
      resize(other.size());
      if(other.size()>0)
      {
        internal::smart_copy(other.m_values,  other.m_values  + m_size, m_values);
        internal::smart_copy(other.m_indices, other.m_indices + m_size, m_indices);
      }
      return *this;
    }